

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O1

bool set_sigalg_prefs(Array<unsigned_short> *out,Span<const_unsigned_short> prefs)

{
  ulong uVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  unsigned_short uVar4;
  Array<unsigned_short> *pAVar5;
  bool bVar6;
  long lVar7;
  unsigned_short *__src;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  iterator __begin1;
  bool bVar11;
  Array<unsigned_short> filtered;
  Array<unsigned_short> local_58;
  ulong local_40;
  Array<unsigned_short> *local_38;
  
  uVar9 = prefs.size_;
  __src = prefs.data_;
  if (1 < uVar9) {
    local_58.data_ = (unsigned_short *)0x0;
    local_58.size_ = 0;
    bVar6 = bssl::Array<unsigned_short>::InitUninitialized(&local_58,uVar9);
    if (bVar6) {
      memmove(local_58.data_,__src,uVar9 * 2);
      puVar2 = local_58.data_;
      if (local_58.size_ != 0) {
        lVar7 = 0x3f;
        if (local_58.size_ != 0) {
          for (; local_58.size_ >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::__introsort_loop<unsigned_short*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_58.data_,local_58.data_ + local_58.size_,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_less_iter>(puVar2);
      }
      bVar6 = local_58.size_ < 2;
      if (!bVar6) {
        if (*local_58.data_ == local_58.data_[1]) {
          bVar6 = false;
        }
        else {
          uVar8 = 1;
          do {
            if ((2 - local_58.size_) + uVar8 == 1) {
              bVar6 = true;
              goto LAB_0015e633;
            }
            puVar2 = local_58.data_ + uVar8;
            uVar1 = uVar8 + 1;
            lVar7 = uVar8 + 1;
            uVar8 = uVar1;
          } while (*puVar2 != local_58.data_[lVar7]);
          bVar6 = local_58.size_ <= uVar1;
        }
        ERR_put_error(0x10,0,0x128,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                      ,0x217);
      }
    }
    else {
      bVar6 = false;
    }
LAB_0015e633:
    OPENSSL_free(local_58.data_);
    if (!bVar6) {
      return false;
    }
  }
  local_58.data_ = (unsigned_short *)0x0;
  local_58.size_ = 0;
  bVar6 = bssl::Array<unsigned_short>::InitUninitialized(&local_58,uVar9);
  if (bVar6) {
    bVar6 = uVar9 == 0;
    local_40 = uVar9;
    local_38 = out;
    if (bVar6) {
      uVar9 = 0;
    }
    else {
      puVar2 = __src + uVar9;
      uVar9 = 0;
      do {
        uVar4 = *__src;
        iVar10 = 3;
        if (uVar4 != 0xff01) {
          lVar7 = 0;
          do {
            puVar3 = (unsigned_short *)((long)&bssl::kSignatureAlgorithms + lVar7);
            if (*puVar3 == uVar4) break;
            bVar11 = lVar7 != 0x1a0;
            lVar7 = lVar7 + 0x20;
          } while (bVar11);
          if (*puVar3 == uVar4) {
            if (local_58.size_ <= uVar9) goto LAB_0015e7b1;
            local_58.data_[uVar9] = uVar4;
            uVar9 = uVar9 + 1;
            iVar10 = 0;
          }
          else {
            iVar10 = 1;
            ERR_put_error(0x10,0,0x127,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                          ,0x233);
          }
        }
        if ((iVar10 != 3) && (iVar10 != 0)) break;
        __src = __src + 1;
        bVar6 = __src == puVar2;
      } while (!bVar6);
    }
    pAVar5 = local_38;
    if (bVar6) {
      if (local_58.size_ < uVar9) {
LAB_0015e7b1:
        abort();
      }
      local_58.size_ = uVar9;
      if (uVar9 == 0 && local_40 != 0) {
        bVar6 = false;
        ERR_put_error(0x10,0,0x127,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                      ,0x23f);
      }
      else {
        OPENSSL_free(local_38->data_);
        pAVar5->data_ = (unsigned_short *)0x0;
        pAVar5->size_ = 0;
        pAVar5->data_ = local_58.data_;
        pAVar5->size_ = local_58.size_;
        local_58.data_ = (unsigned_short *)0x0;
        local_58.size_ = 0;
        bVar6 = true;
      }
      goto LAB_0015e771;
    }
  }
  bVar6 = false;
LAB_0015e771:
  OPENSSL_free(local_58.data_);
  return bVar6;
}

Assistant:

static bool set_sigalg_prefs(Array<uint16_t> *out, Span<const uint16_t> prefs) {
  if (!sigalgs_unique(prefs)) {
    return false;
  }

  // Check for invalid algorithms, and filter out |SSL_SIGN_RSA_PKCS1_MD5_SHA1|.
  Array<uint16_t> filtered;
  if (!filtered.InitForOverwrite(prefs.size())) {
    return false;
  }
  size_t added = 0;
  for (uint16_t pref : prefs) {
    if (pref == SSL_SIGN_RSA_PKCS1_MD5_SHA1) {
      // Though not intended to be used with this API, we treat
      // |SSL_SIGN_RSA_PKCS1_MD5_SHA1| as a real signature algorithm in
      // |SSL_PRIVATE_KEY_METHOD|. Not accepting it here makes for a confusing
      // abstraction.
      continue;
    }
    if (get_signature_algorithm(pref) == nullptr) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SIGNATURE_ALGORITHM);
      return false;
    }
    filtered[added] = pref;
    added++;
  }
  filtered.Shrink(added);

  // This can happen if |prefs| contained only |SSL_SIGN_RSA_PKCS1_MD5_SHA1|.
  // Leaving it empty would revert to the default, so treat this as an error
  // condition.
  if (!prefs.empty() && filtered.empty()) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SIGNATURE_ALGORITHM);
    return false;
  }

  *out = std::move(filtered);
  return true;
}